

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderControlStatementTests.cpp
# Opt level: O0

int __thiscall deqp::gles2::Performance::LoopCase::init(LoopCase *this,EVP_PKEY_CTX *ctx)

{
  float fVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  size_type sVar5;
  reference pvVar6;
  value_type *__x;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  value_type local_614;
  char *local_5e0;
  ostringstream *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  Vector<float,_4> local_568;
  Vector<float,_4> local_558;
  Vector<float,_4> local_548;
  Vector<float,_4> local_538;
  AttribSpec local_528;
  Vector<float,_4> local_4c8;
  Vector<float,_4> local_4b8;
  Vector<float,_4> local_4a8;
  Vector<float,_4> local_498;
  AttribSpec local_488;
  float local_424;
  float local_420;
  float maxValue;
  float minValue;
  int i;
  int numVertices;
  int numComponents;
  Vector<float,_4> local_400;
  Vector<float,_4> local_3f0;
  Vector<float,_4> local_3e0;
  AttribSpec local_3d0;
  string local_370 [32];
  string local_350 [32];
  ostringstream *local_330;
  ostringstream *op;
  undefined1 local_318 [8];
  ostringstream frag;
  ostringstream vtx;
  char *boundValueStr;
  float unstableBoundHigh;
  float unstableBoundLow;
  float loopBound;
  bool isAttributeCase;
  bool isUniformCase;
  bool isStaticCase;
  bool isVertexCase;
  LoopCase *this_local;
  
  bVar7 = (this->super_ControlStatementCase).super_ShaderPerformanceCase.m_caseType !=
          CASETYPE_VERTEX;
  bVar8 = this->m_decisionType == DECISION_UNIFORM;
  bVar9 = this->m_decisionType == DECISION_ATTRIBUTE;
  if (this->m_decisionType == DECISION_STATIC) {
    local_578 = init::loopBoundStr;
  }
  else {
    if (bVar8) {
      local_580 = "u_bound";
    }
    else {
      if (bVar7) {
        local_588 = "loopBound";
        if ((this->m_isLoopBoundStable & 1U) != 0) {
          local_588 = "v_bound";
        }
      }
      else {
        local_588 = "a_bound";
      }
      local_580 = local_588;
    }
    local_578 = local_580;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
  if (bVar7) {
    local_590 = (ostringstream *)local_318;
  }
  else {
    local_590 = (ostringstream *)&frag.field_0x170;
  }
  local_330 = local_590;
  std::operator<<((ostream *)&frag.field_0x170,"attribute highp vec4 a_position;\n");
  std::operator<<((ostream *)&frag.field_0x170,"attribute mediump vec4 a_value;\n");
  if (bVar9) {
    std::operator<<((ostream *)&frag.field_0x170,"attribute mediump float a_bound;\n");
  }
  else if (bVar8) {
    std::operator<<(&local_330->super_basic_ostream<char,_std::char_traits<char>_>,
                    "uniform mediump float u_bound;\n");
  }
  if (bVar7) {
    std::operator<<((ostream *)&frag.field_0x170,"varying mediump vec4 v_value;\n");
    std::operator<<((ostream *)local_318,"varying mediump vec4 v_value;\n");
    if (bVar9) {
      std::operator<<((ostream *)&frag.field_0x170,"varying mediump float v_bound;\n");
      std::operator<<((ostream *)local_318,"varying mediump float v_bound;\n");
    }
  }
  else {
    std::operator<<((ostream *)&frag.field_0x170,"varying mediump vec4 v_color;\n");
    std::operator<<((ostream *)local_318,"varying mediump vec4 v_color;\n");
  }
  std::operator<<((ostream *)&frag.field_0x170,"\n");
  std::operator<<((ostream *)&frag.field_0x170,"void main()\n");
  std::operator<<((ostream *)&frag.field_0x170,"{\n");
  std::operator<<((ostream *)&frag.field_0x170,"\tgl_Position = a_position;\n");
  std::operator<<((ostream *)local_318,"\n");
  std::operator<<((ostream *)local_318,"void main()\n");
  std::operator<<((ostream *)local_318,"{\n");
  std::operator<<(&local_330->super_basic_ostream<char,_std::char_traits<char>_>,
                  "\tmediump vec4 res = vec4(0.0);\n");
  if (((this->m_isLoopBoundStable & 1U) == 0) && (bVar7)) {
    poVar4 = std::operator<<(&local_330->super_basic_ostream<char,_std::char_traits<char>_>,
                             "\tmediump float loopBound = fract(v_bound) < 0.5 ? ");
    poVar4 = std::operator<<(poVar4,init::unstableBoundLowStr);
    poVar4 = std::operator<<(poVar4," : ");
    poVar4 = std::operator<<(poVar4,init::unstableBoundHighStr);
    std::operator<<(poVar4,";\n");
  }
  if (this->m_type == LOOP_FOR) {
    poVar4 = std::operator<<(&local_330->super_basic_ostream<char,_std::char_traits<char>_>,
                             "\tfor (mediump float i = 0.0; i < ");
    poVar4 = std::operator<<(poVar4,local_578);
    std::operator<<(poVar4,"; i++)\n");
  }
  else {
    std::operator<<(&local_330->super_basic_ostream<char,_std::char_traits<char>_>,
                    "\tmediump float i = 0.0;\n");
    if (this->m_type == LOOP_WHILE) {
      poVar4 = std::operator<<(&local_330->super_basic_ostream<char,_std::char_traits<char>_>,
                               "\twhile (i < ");
      poVar4 = std::operator<<(poVar4,local_578);
      std::operator<<(poVar4,")\n");
    }
    else {
      std::operator<<(&local_330->super_basic_ostream<char,_std::char_traits<char>_>,"\tdo\n");
    }
  }
  std::operator<<(&local_330->super_basic_ostream<char,_std::char_traits<char>_>,"\t{\n");
  std::operator<<(&local_330->super_basic_ostream<char,_std::char_traits<char>_>,"\t\t");
  if (bVar7) {
    local_5e0 = "v_value";
  }
  else {
    local_5e0 = "a_value";
  }
  writeLoopWorkload(local_330,"res",local_5e0);
  std::operator<<(&local_330->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  if (this->m_type != LOOP_FOR) {
    std::operator<<(&local_330->super_basic_ostream<char,_std::char_traits<char>_>,"\t\ti++;\n");
  }
  if (this->m_type == LOOP_DO_WHILE) {
    poVar4 = std::operator<<(&local_330->super_basic_ostream<char,_std::char_traits<char>_>,
                             "\t} while (i < ");
    poVar4 = std::operator<<(poVar4,local_578);
    std::operator<<(poVar4,");\n");
  }
  else {
    std::operator<<(&local_330->super_basic_ostream<char,_std::char_traits<char>_>,"\t}\n");
  }
  if (bVar7) {
    if (bVar9) {
      std::operator<<((ostream *)&frag.field_0x170,"\tv_bound = a_bound;\n");
    }
    std::operator<<((ostream *)&frag.field_0x170,"\tv_value = a_value;\n");
    std::operator<<((ostream *)local_318,"\tgl_FragColor = res;\n");
  }
  else {
    std::operator<<((ostream *)&frag.field_0x170,"\tv_color = res;\n");
    std::operator<<((ostream *)local_318,"\tgl_FragColor = v_color;\n");
  }
  std::operator<<((ostream *)&frag.field_0x170,"}\n");
  std::operator<<((ostream *)local_318,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_vertShaderSource,
             local_350);
  std::__cxx11::string::~string(local_350);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_fragShaderSource,
             local_370);
  std::__cxx11::string::~string(local_370);
  if (bVar9) {
    if ((this->m_isLoopBoundStable & 1U) == 0) {
      if (bVar7) {
        local_420 = 0.0;
        iVar3 = deqp::gls::ShaderPerformanceCase::getViewportWidth((ShaderPerformanceCase *)this);
        local_424 = (float)iVar3 * 0.5;
        tcu::Vector<float,_4>::Vector(&local_498,local_420,0.0,0.0,0.0);
        tcu::Vector<float,_4>::Vector(&local_4a8,local_424,0.0,0.0,0.0);
        tcu::Vector<float,_4>::Vector(&local_4b8,local_420,0.0,0.0,0.0);
        tcu::Vector<float,_4>::Vector(&local_4c8,local_424,0.0,0.0,0.0);
        deqp::gls::AttribSpec::AttribSpec
                  (&local_488,"a_bound",&local_498,&local_4a8,&local_4b8,&local_4c8);
        std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::push_back
                  (&(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_attributes,
                   &local_488);
        deqp::gls::AttribSpec::~AttribSpec(&local_488);
      }
      else {
        i = 4;
        iVar3 = deqp::gls::ShaderPerformanceCase::getGridWidth((ShaderPerformanceCase *)this);
        iVar2 = deqp::gls::ShaderPerformanceCase::getGridHeight((ShaderPerformanceCase *)this);
        minValue = (float)((iVar3 + 1) * (iVar2 + 1));
        std::vector<float,_std::allocator<float>_>::resize
                  (&this->m_boundArray,(long)((int)minValue * 4));
        for (maxValue = 0.0; fVar1 = maxValue,
            sVar5 = std::vector<float,_std::allocator<float>_>::size(&this->m_boundArray),
            (int)fVar1 < (int)sVar5; maxValue = (float)((int)maxValue + 1)) {
          if ((int)maxValue % 4 == 0) {
            local_614 = 5.5;
            if ((int)((long)((ulong)(uint)((int)((long)(int)maxValue / 4) >> 0x1f) << 0x20 |
                            (long)(int)maxValue / 4 & 0xffffffffU) % 2) != 0) {
              local_614 = 15.5;
            }
            pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                               (&this->m_boundArray,(long)(int)maxValue);
            *pvVar6 = local_614;
          }
          else {
            pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                               (&this->m_boundArray,(long)(int)maxValue);
            *pvVar6 = 0.0;
          }
        }
      }
    }
    else {
      tcu::Vector<float,_4>::Vector(&local_3e0,10.5,0.0,0.0,0.0);
      tcu::Vector<float,_4>::Vector(&local_3f0,10.5,0.0,0.0,0.0);
      tcu::Vector<float,_4>::Vector(&local_400,10.5,0.0,0.0,0.0);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&numVertices,10.5,0.0,0.0,0.0);
      deqp::gls::AttribSpec::AttribSpec
                (&local_3d0,"a_bound",&local_3e0,&local_3f0,&local_400,(Vec4 *)&numVertices);
      std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::push_back
                (&(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_attributes,
                 &local_3d0);
      deqp::gls::AttribSpec::~AttribSpec(&local_3d0);
    }
  }
  tcu::Vector<float,_4>::Vector(&local_538,0.0,0.1,0.2,0.3);
  tcu::Vector<float,_4>::Vector(&local_548,0.4,0.5,0.6,0.7);
  tcu::Vector<float,_4>::Vector(&local_558,0.8,0.9,1.0,1.1);
  tcu::Vector<float,_4>::Vector(&local_568,1.2,1.3,1.4,1.5);
  deqp::gls::AttribSpec::AttribSpec
            (&local_528,"a_value",&local_538,&local_548,&local_558,&local_568);
  __x = &local_528;
  std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::push_back
            (&(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_attributes,__x);
  deqp::gls::AttribSpec::~AttribSpec(&local_528);
  ControlStatementCase::init(&this->super_ControlStatementCase,(EVP_PKEY_CTX *)__x);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
  iVar3 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag.field_0x170);
  return iVar3;
}

Assistant:

void LoopCase::init (void)
{
	bool				isVertexCase	= m_caseType == CASETYPE_VERTEX;

	bool				isStaticCase	= m_decisionType == DECISION_STATIC;
	bool				isUniformCase	= m_decisionType == DECISION_UNIFORM;
	bool				isAttributeCase	= m_decisionType == DECISION_ATTRIBUTE;

	DE_ASSERT(isStaticCase || isUniformCase || isAttributeCase);

	DE_ASSERT(m_type == LOOP_FOR		||
			  m_type == LOOP_WHILE		||
			  m_type == LOOP_DO_WHILE);

	DE_ASSERT(isAttributeCase || m_isLoopBoundStable); // The loop bound count can vary between executions only if using attribute input.

	// \note The fractional part is .5 (instead of .0) so that these can be safely used as loop bounds.
	const float			loopBound				= 10.5f;
	const float			unstableBoundLow		= 5.5f;
	const float			unstableBoundHigh		= 15.5f;
	static const char*	loopBoundStr			= "10.5";
	static const char*	unstableBoundLowStr		= "5.5";
	static const char*	unstableBoundHighStr	= "15.5";

	const char*			boundValueStr		= isStaticCase			? loopBoundStr :
											  isUniformCase			? "u_bound" :
											  isVertexCase			? "a_bound" :
											  m_isLoopBoundStable	? "v_bound" :
																	  "loopBound";

	std::ostringstream	vtx;
	std::ostringstream	frag;
	std::ostringstream&	op		= isVertexCase ? vtx : frag;

	vtx << "attribute highp vec4 a_position;\n";	// Position attribute.
	vtx << "attribute mediump vec4 a_value;\n";		// Input for workload calculations.

	// Value to be used as the loop iteration count.
	if (isAttributeCase)
		vtx << "attribute mediump float a_bound;\n";
	else if (isUniformCase)
		op << "uniform mediump float u_bound;\n";

	// Varyings.
	if (isVertexCase)
	{
		vtx << "varying mediump vec4 v_color;\n";
		frag << "varying mediump vec4 v_color;\n";
	}
	else
	{
		vtx << "varying mediump vec4 v_value;\n";
		frag << "varying mediump vec4 v_value;\n";

		if (isAttributeCase)
		{
			vtx << "varying mediump float v_bound;\n";
			frag << "varying mediump float v_bound;\n";
		}
	}

	vtx << "\n";
	vtx << "void main()\n";
	vtx << "{\n";
	vtx << "	gl_Position = a_position;\n";

	frag << "\n";
	frag << "void main()\n";
	frag << "{\n";

	op << "	mediump vec4 res = vec4(0.0);\n";

	if (!m_isLoopBoundStable && !isVertexCase)
	{
		// Choose the actual loop bound based on v_bound.
		// \note Loop bound will vary with high frequency between fragment columns, given appropriate range for v_bound.
		op << "	mediump float loopBound = fract(v_bound) < 0.5 ? " << unstableBoundLowStr << " : " << unstableBoundHighStr << ";\n";
	}

	// Start a for, while or do-while loop.
	if (m_type == LOOP_FOR)
		op << "	for (mediump float i = 0.0; i < " << boundValueStr << "; i++)\n";
	else
	{
		op << "	mediump float i = 0.0;\n";
		if (m_type == LOOP_WHILE)
			op << "	while (i < " << boundValueStr << ")\n";
		else // LOOP_DO_WHILE
			op << "	do\n";
	}
	op << "	{\n";

	// Workload calculations inside the loop.
	op << "\t\t";
	writeLoopWorkload(op, "res", isVertexCase ? "a_value" : "v_value");
	op << "\n";

	// Only "for" has counter increment in the loop head.
	if (m_type != LOOP_FOR)
		op << "		i++;\n";

	// End the loop.
	if (m_type == LOOP_DO_WHILE)
		op << "	} while (i < " << boundValueStr << ");\n";
	else
		op << "	}\n";

	if (isVertexCase)
	{
		// Put result to color variable.
		vtx << "	v_color = res;\n";
		frag << "	gl_FragColor = v_color;\n";
	}
	else
	{
		// Transfer inputs to fragment shader through varyings.
		if (isAttributeCase)
			vtx << "	v_bound = a_bound;\n";
		vtx << "	v_value = a_value;\n";

		frag << "	gl_FragColor = res;\n"; // Put result to color variable.
	}

	vtx << "}\n";
	frag << "}\n";

	m_vertShaderSource = vtx.str();
	m_fragShaderSource = frag.str();

	if (isAttributeCase)
	{
		if (m_isLoopBoundStable)
		{
			// Every execution has same number of iterations.

			m_attributes.push_back(AttribSpec("a_bound",	Vec4(loopBound, 0.0f, 0.0f, 0.0f),
															Vec4(loopBound, 0.0f, 0.0f, 0.0f),
															Vec4(loopBound, 0.0f, 0.0f, 0.0f),
															Vec4(loopBound, 0.0f, 0.0f, 0.0f)));
		}
		else if (isVertexCase)
		{
			// Vertex case, with non-constant number of iterations.

			const int	numComponents	= 4;
			int			numVertices		= (getGridWidth() + 1) * (getGridHeight() + 1);

			// setupProgram() will later bind this array as an attribute.
			m_boundArray.resize(numVertices * numComponents);

			// Vary between low and high loop bounds; they should average to loopBound however.
			for (int i = 0; i < (int)m_boundArray.size(); i++)
			{
				if (i % numComponents == 0)
					m_boundArray[i] = (i / numComponents) % 2 == 0 ? unstableBoundLow : unstableBoundHigh;
				else
					m_boundArray[i] = 0.0f;
			}
		}
		else // !m_isLoopBoundStable && !isVertexCase
		{
			// Fragment case, with non-constant number of iterations.
			// \note fract(a_bound) < 0.5 will be true for every second fragment.

			float minValue = 0.0f;
			float maxValue = (float)getViewportWidth()*0.5f;
			m_attributes.push_back(AttribSpec("a_bound",	Vec4(minValue, 0.0f, 0.0f, 0.0f),
															Vec4(maxValue, 0.0f, 0.0f, 0.0f),
															Vec4(minValue, 0.0f, 0.0f, 0.0f),
															Vec4(maxValue, 0.0f, 0.0f, 0.0f)));
		}
	}

	m_attributes.push_back(AttribSpec("a_value",	Vec4(0.0f, 0.1f, 0.2f, 0.3f),
													Vec4(0.4f, 0.5f, 0.6f, 0.7f),
													Vec4(0.8f, 0.9f, 1.0f, 1.1f),
													Vec4(1.2f, 1.3f, 1.4f, 1.5f)));

	ControlStatementCase::init();
}